

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O2

QChar * QIPAddressUtils::checkedToAscii(Buffer *buffer,QChar *begin,QChar *end)

{
  char16_t *pcVar1;
  undefined1 *puVar2;
  
  QVarLengthArray<char,_64LL>::resize(buffer,((long)end - (long)begin >> 1) + 1);
  puVar2 = (undefined1 *)(buffer->super_QVLABase<char>).super_QVLABaseBase.ptr;
  while( true ) {
    if (begin == end) {
      *puVar2 = 0;
      return (QChar *)0x0;
    }
    pcVar1 = &begin->ucs;
    if (0x7e < (ushort)*pcVar1) break;
    begin = begin + 1;
    *puVar2 = (char)*pcVar1;
    puVar2 = puVar2 + 1;
  }
  return begin;
}

Assistant:

static const QChar *checkedToAscii(Buffer &buffer, const QChar *begin, const QChar *end)
{
    const auto *const ubegin = reinterpret_cast<const char16_t *>(begin);
    const auto *const uend = reinterpret_cast<const char16_t *>(end);
    auto *src = ubegin;

    buffer.resize(uend - ubegin + 1);
    char *dst = buffer.data();

    while (src != uend) {
        if (*src >= 0x7f)
            return reinterpret_cast<const QChar *>(src);
        *dst++ = *src++;
    }
    *dst = '\0';
    return nullptr;
}